

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O0

X509_POLICY_LEVEL * process_policy_mappings(X509 *cert,X509_POLICY_LEVEL *level,int mapping_allowed)

{
  int iVar1;
  size_t sVar2;
  POLICY_MAPPING *pPVar3;
  X509_POLICY_NODE *pXVar4;
  POLICY_MAPPING *a;
  ASN1_OBJECT *pAVar5;
  POLICY_MAPPING *mapping_3;
  size_t i_3;
  X509_POLICY_NODE *last_node;
  POLICY_MAPPING *mapping_2;
  X509_POLICY_NODE *node_1;
  size_t i_2;
  X509_POLICY_NODE *node;
  POLICY_MAPPING *mapping_1;
  size_t i_1;
  ASN1_OBJECT *last_policy;
  POLICY_MAPPING *mapping;
  size_t i;
  POLICY_MAPPINGS *mappings;
  X509_POLICY_LEVEL *pXStack_30;
  int critical;
  X509_POLICY_LEVEL *next;
  stack_st_X509_POLICY_NODE *new_nodes;
  int ok;
  int mapping_allowed_local;
  X509_POLICY_LEVEL *level_local;
  X509 *cert_local;
  
  new_nodes._0_4_ = 0;
  next = (X509_POLICY_LEVEL *)0x0;
  pXStack_30 = (X509_POLICY_LEVEL *)0x0;
  new_nodes._4_4_ = mapping_allowed;
  _ok = level;
  level_local = (X509_POLICY_LEVEL *)cert;
  i = (size_t)X509_get_ext_d2i((X509 *)cert,0x2eb,(int *)((long)&mappings + 4),(int *)0x0);
  if (((stack_st_POLICY_MAPPING *)i == (stack_st_POLICY_MAPPING *)0x0) && (mappings._4_4_ != -1))
  goto LAB_002dddbd;
  if ((stack_st_POLICY_MAPPING *)i != (stack_st_POLICY_MAPPING *)0x0) {
    sVar2 = sk_POLICY_MAPPING_num((stack_st_POLICY_MAPPING *)i);
    if (sVar2 == 0) {
      ERR_put_error(0xb,0,0x90,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                    ,0x17b);
      goto LAB_002dddbd;
    }
    for (mapping = (POLICY_MAPPING *)0x0;
        pPVar3 = (POLICY_MAPPING *)sk_POLICY_MAPPING_num((stack_st_POLICY_MAPPING *)i),
        mapping < pPVar3; mapping = (POLICY_MAPPING *)((long)&mapping->issuerDomainPolicy + 1)) {
      pPVar3 = sk_POLICY_MAPPING_value((stack_st_POLICY_MAPPING *)i,(size_t)mapping);
      iVar1 = is_any_policy(pPVar3->issuerDomainPolicy);
      if ((iVar1 != 0) || (iVar1 = is_any_policy(pPVar3->subjectDomainPolicy), iVar1 != 0))
      goto LAB_002dddbd;
    }
    sk_POLICY_MAPPING_set_cmp_func((stack_st_POLICY_MAPPING *)i,compare_issuer_policy);
    sk_POLICY_MAPPING_sort((stack_st_POLICY_MAPPING *)i);
    if (new_nodes._4_4_ == 0) {
      sk_X509_POLICY_NODE_delete_if(_ok->nodes,delete_if_mapped,(void *)i);
      sk_POLICY_MAPPING_pop_free((stack_st_POLICY_MAPPING *)i,POLICY_MAPPING_free);
      i = 0;
    }
    else {
      next = (X509_POLICY_LEVEL *)sk_X509_POLICY_NODE_new_null();
      if (next == (X509_POLICY_LEVEL *)0x0) goto LAB_002dddbd;
      i_1 = 0;
      for (mapping_1 = (POLICY_MAPPING *)0x0;
          pPVar3 = (POLICY_MAPPING *)sk_POLICY_MAPPING_num((stack_st_POLICY_MAPPING *)i),
          mapping_1 < pPVar3;
          mapping_1 = (POLICY_MAPPING *)((long)&mapping_1->issuerDomainPolicy + 1)) {
        pPVar3 = sk_POLICY_MAPPING_value((stack_st_POLICY_MAPPING *)i,(size_t)mapping_1);
        if ((i_1 == 0) ||
           (iVar1 = OBJ_cmp((ASN1_OBJECT *)pPVar3->issuerDomainPolicy,(ASN1_OBJECT *)i_1),
           iVar1 != 0)) {
          i_1 = (size_t)pPVar3->issuerDomainPolicy;
          i_2 = (size_t)x509_policy_level_find(_ok,pPVar3->issuerDomainPolicy);
          if ((X509_POLICY_NODE *)i_2 == (X509_POLICY_NODE *)0x0) {
            if (_ok->has_any_policy == 0) goto LAB_002ddadf;
            i_2 = (size_t)x509_policy_node_new(pPVar3->issuerDomainPolicy);
            if (((X509_POLICY_NODE *)i_2 == (X509_POLICY_NODE *)0x0) ||
               (sVar2 = sk_X509_POLICY_NODE_push
                                  ((stack_st_X509_POLICY_NODE *)next,(X509_POLICY_NODE *)i_2),
               sVar2 == 0)) {
              x509_policy_node_free((X509_POLICY_NODE *)i_2);
              goto LAB_002dddbd;
            }
          }
          *(undefined4 *)(i_2 + 0x10) = 1;
        }
LAB_002ddadf:
      }
      iVar1 = x509_policy_level_add_nodes(_ok,(stack_st_X509_POLICY_NODE *)next);
      if (iVar1 == 0) goto LAB_002dddbd;
    }
  }
  if ((i != 0) ||
     (i = (size_t)sk_POLICY_MAPPING_new_null(),
     (stack_st_POLICY_MAPPING *)i != (stack_st_POLICY_MAPPING *)0x0)) {
    for (node_1 = (X509_POLICY_NODE *)0x0;
        pXVar4 = (X509_POLICY_NODE *)sk_X509_POLICY_NODE_num(_ok->nodes), node_1 < pXVar4;
        node_1 = (X509_POLICY_NODE *)((long)&node_1->policy + 1)) {
      pXVar4 = sk_X509_POLICY_NODE_value(_ok->nodes,(size_t)node_1);
      if (pXVar4->mapped == 0) {
        a = POLICY_MAPPING_new();
        if (a == (POLICY_MAPPING *)0x0) goto LAB_002dddbd;
        pAVar5 = OBJ_dup((ASN1_OBJECT *)pXVar4->policy);
        a->issuerDomainPolicy = pAVar5;
        pAVar5 = OBJ_dup((ASN1_OBJECT *)pXVar4->policy);
        a->subjectDomainPolicy = pAVar5;
        if (((a->issuerDomainPolicy == (ASN1_OBJECT *)0x0) ||
            (a->subjectDomainPolicy == (ASN1_OBJECT *)0x0)) ||
           (sVar2 = sk_POLICY_MAPPING_push((stack_st_POLICY_MAPPING *)i,(POLICY_MAPPING *)a),
           sVar2 == 0)) {
          POLICY_MAPPING_free(a);
          goto LAB_002dddbd;
        }
      }
    }
    sk_POLICY_MAPPING_set_cmp_func((stack_st_POLICY_MAPPING *)i,compare_subject_policy);
    sk_POLICY_MAPPING_sort((stack_st_POLICY_MAPPING *)i);
    pXStack_30 = x509_policy_level_new();
    if (pXStack_30 != (X509_POLICY_LEVEL *)0x0) {
      pXStack_30->has_any_policy = _ok->has_any_policy;
      i_3 = 0;
      for (mapping_3 = (POLICY_MAPPING *)0x0;
          pPVar3 = (POLICY_MAPPING *)sk_POLICY_MAPPING_num((stack_st_POLICY_MAPPING *)i),
          mapping_3 < pPVar3;
          mapping_3 = (POLICY_MAPPING *)((long)&mapping_3->issuerDomainPolicy + 1)) {
        pPVar3 = sk_POLICY_MAPPING_value((stack_st_POLICY_MAPPING *)i,(size_t)mapping_3);
        if ((_ok->has_any_policy != 0) ||
           (pXVar4 = x509_policy_level_find(_ok,pPVar3->issuerDomainPolicy),
           pXVar4 != (X509_POLICY_NODE *)0x0)) {
          if (((i_3 == 0) ||
              (iVar1 = OBJ_cmp(*(ASN1_OBJECT **)i_3,(ASN1_OBJECT *)pPVar3->subjectDomainPolicy),
              iVar1 != 0)) &&
             ((i_3 = (size_t)x509_policy_node_new(pPVar3->subjectDomainPolicy),
              (X509_POLICY_NODE *)i_3 == (X509_POLICY_NODE *)0x0 ||
              (sVar2 = sk_X509_POLICY_NODE_push(pXStack_30->nodes,(X509_POLICY_NODE *)i_3),
              sVar2 == 0)))) {
            x509_policy_node_free((X509_POLICY_NODE *)i_3);
            goto LAB_002dddbd;
          }
          sVar2 = sk_ASN1_OBJECT_push(*(stack_st_ASN1_OBJECT **)(i_3 + 8),pPVar3->issuerDomainPolicy
                                     );
          if (sVar2 == 0) goto LAB_002dddbd;
          pPVar3->issuerDomainPolicy = (ASN1_OBJECT *)0x0;
        }
      }
      sk_X509_POLICY_NODE_sort(pXStack_30->nodes);
      new_nodes._0_4_ = 1;
    }
  }
LAB_002dddbd:
  if ((int)new_nodes == 0) {
    x509_policy_level_free(pXStack_30);
    pXStack_30 = (X509_POLICY_LEVEL *)0x0;
  }
  sk_POLICY_MAPPING_pop_free((stack_st_POLICY_MAPPING *)i,POLICY_MAPPING_free);
  sk_X509_POLICY_NODE_pop_free((stack_st_X509_POLICY_NODE *)next,x509_policy_node_free);
  return pXStack_30;
}

Assistant:

static X509_POLICY_LEVEL *process_policy_mappings(const X509 *cert,
                                                  X509_POLICY_LEVEL *level,
                                                  int mapping_allowed) {
  int ok = 0;
  STACK_OF(X509_POLICY_NODE) *new_nodes = NULL;
  X509_POLICY_LEVEL *next = NULL;
  int critical;
  POLICY_MAPPINGS *mappings = reinterpret_cast<POLICY_MAPPINGS *>(
      X509_get_ext_d2i(cert, NID_policy_mappings, &critical, NULL));

  {
    if (mappings == NULL && critical != -1) {
      // Syntax error in the policy mappings extension.
      goto err;
    }

    if (mappings != NULL) {
      // PolicyMappings may not be empty. See RFC 5280, section 4.2.1.5.
      // TODO(https://crbug.com/boringssl/443): Move this check into the parser.
      if (sk_POLICY_MAPPING_num(mappings) == 0) {
        OPENSSL_PUT_ERROR(X509, X509_R_INVALID_POLICY_EXTENSION);
        goto err;
      }

      // RFC 5280, section 6.1.4, step (a).
      for (size_t i = 0; i < sk_POLICY_MAPPING_num(mappings); i++) {
        POLICY_MAPPING *mapping = sk_POLICY_MAPPING_value(mappings, i);
        if (is_any_policy(mapping->issuerDomainPolicy) ||
            is_any_policy(mapping->subjectDomainPolicy)) {
          goto err;
        }
      }

      // Sort to group by issuerDomainPolicy.
      sk_POLICY_MAPPING_set_cmp_func(mappings, compare_issuer_policy);
      sk_POLICY_MAPPING_sort(mappings);

      if (mapping_allowed) {
        // Mark nodes as mapped, and add any nodes to |level| which may be
        // needed as part of RFC 5280, section 6.1.4, step (b.1).
        new_nodes = sk_X509_POLICY_NODE_new_null();
        if (new_nodes == NULL) {
          goto err;
        }
        const ASN1_OBJECT *last_policy = NULL;
        for (size_t i = 0; i < sk_POLICY_MAPPING_num(mappings); i++) {
          const POLICY_MAPPING *mapping = sk_POLICY_MAPPING_value(mappings, i);
          // There may be multiple mappings with the same |issuerDomainPolicy|.
          if (last_policy != NULL &&
              OBJ_cmp(mapping->issuerDomainPolicy, last_policy) == 0) {
            continue;
          }
          last_policy = mapping->issuerDomainPolicy;

          X509_POLICY_NODE *node =
              x509_policy_level_find(level, mapping->issuerDomainPolicy);
          if (node == NULL) {
            if (!level->has_any_policy) {
              continue;
            }
            node = x509_policy_node_new(mapping->issuerDomainPolicy);
            if (node == NULL ||  //
                !sk_X509_POLICY_NODE_push(new_nodes, node)) {
              x509_policy_node_free(node);
              goto err;
            }
          }
          node->mapped = 1;
        }
        if (!x509_policy_level_add_nodes(level, new_nodes)) {
          goto err;
        }
      } else {
        // RFC 5280, section 6.1.4, step (b.2). If mapping is inhibited, delete
        // all mapped nodes.
        sk_X509_POLICY_NODE_delete_if(level->nodes, delete_if_mapped, mappings);
        sk_POLICY_MAPPING_pop_free(mappings, POLICY_MAPPING_free);
        mappings = NULL;
      }
    }

    // If a node was not mapped, it retains the original "explicit_policy_set"
    // value, itself. Add those to |mappings|.
    if (mappings == NULL) {
      mappings = sk_POLICY_MAPPING_new_null();
      if (mappings == NULL) {
        goto err;
      }
    }
    for (size_t i = 0; i < sk_X509_POLICY_NODE_num(level->nodes); i++) {
      X509_POLICY_NODE *node = sk_X509_POLICY_NODE_value(level->nodes, i);
      if (!node->mapped) {
        POLICY_MAPPING *mapping = POLICY_MAPPING_new();
        if (mapping == NULL) {
          goto err;
        }
        mapping->issuerDomainPolicy = OBJ_dup(node->policy);
        mapping->subjectDomainPolicy = OBJ_dup(node->policy);
        if (mapping->issuerDomainPolicy == NULL ||
            mapping->subjectDomainPolicy == NULL ||
            !sk_POLICY_MAPPING_push(mappings, mapping)) {
          POLICY_MAPPING_free(mapping);
          goto err;
        }
      }
    }

    // Sort to group by subjectDomainPolicy.
    sk_POLICY_MAPPING_set_cmp_func(mappings, compare_subject_policy);
    sk_POLICY_MAPPING_sort(mappings);

    // Convert |mappings| to our "expected_policy_set" representation.
    next = x509_policy_level_new();
    if (next == NULL) {
      goto err;
    }
    next->has_any_policy = level->has_any_policy;

    X509_POLICY_NODE *last_node = NULL;
    for (size_t i = 0; i < sk_POLICY_MAPPING_num(mappings); i++) {
      POLICY_MAPPING *mapping = sk_POLICY_MAPPING_value(mappings, i);
      // Skip mappings where |issuerDomainPolicy| does not appear in the graph.
      if (!level->has_any_policy &&
          x509_policy_level_find(level, mapping->issuerDomainPolicy) == NULL) {
        continue;
      }

      if (last_node == NULL ||
          OBJ_cmp(last_node->policy, mapping->subjectDomainPolicy) != 0) {
        last_node = x509_policy_node_new(mapping->subjectDomainPolicy);
        if (last_node == NULL ||
            !sk_X509_POLICY_NODE_push(next->nodes, last_node)) {
          x509_policy_node_free(last_node);
          goto err;
        }
      }

      if (!sk_ASN1_OBJECT_push(last_node->parent_policies,
                               mapping->issuerDomainPolicy)) {
        goto err;
      }
      mapping->issuerDomainPolicy = NULL;
    }

    sk_X509_POLICY_NODE_sort(next->nodes);
    ok = 1;
  }

err:
  if (!ok) {
    x509_policy_level_free(next);
    next = NULL;
  }

  sk_POLICY_MAPPING_pop_free(mappings, POLICY_MAPPING_free);
  sk_X509_POLICY_NODE_pop_free(new_nodes, x509_policy_node_free);
  return next;
}